

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::FindHelper
          (KeyMapBase<unsigned_long> *this,ViewType_conflict1 k)

{
  map_index_t mVar1;
  NodeBase *pNVar2;
  NodeAndBucket NVar3;
  
  AssertLoadFactor(this);
  mVar1 = BucketNumber(this,k);
  pNVar2 = (NodeBase *)((this->super_UntypedMapBase).table_ + mVar1);
  do {
    pNVar2 = pNVar2->next;
    if (pNVar2 == (NodeBase *)0x0) break;
  } while (pNVar2[1].next != (NodeBase *)k);
  NVar3.bucket = mVar1;
  NVar3.node = pNVar2;
  NVar3._12_4_ = 0;
  return NVar3;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }